

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void leveldb::anon_unknown_1::PosixEnv::BackgroundThreadEntryPoint(PosixEnv *env)

{
  PosixEnv *env_local;
  
  BackgroundThreadMain(env);
  return;
}

Assistant:

static void BackgroundThreadEntryPoint(PosixEnv* env) {
    env->BackgroundThreadMain();
  }